

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdParser.cpp
# Opt level: O1

int __thiscall CmdLineArgsParser::ParseInteger(CmdLineArgsParser *this)

{
  WCHAR WVar1;
  LPWSTR pWVar2;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  undefined4 *puVar6;
  undefined8 *puVar7;
  char16_t *pcVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  
  iVar9 = 1;
  if (*this->pszCurrentArg == L'-') {
    this->pszCurrentArg = this->pszCurrentArg + 1;
    iVar9 = -1;
  }
  pWVar2 = this->pszCurrentArg;
  if (9 < (ushort)(*pWVar2 + L'￐')) {
    puVar7 = (undefined8 *)__cxa_allocate_exception(8);
    pcVar8 = L"Integer Expected";
    goto LAB_00353998;
  }
  iVar10 = 10;
  iVar11 = 0;
  if (*pWVar2 == L'0') {
    this->pszCurrentArg = pWVar2 + 1;
    if (pWVar2[1] == L'x') {
      this->pszCurrentArg = pWVar2 + 2;
      iVar10 = 0x10;
      bVar4 = true;
      goto LAB_00353856;
    }
  }
  bVar4 = false;
LAB_00353856:
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  do {
    WVar1 = *this->pszCurrentArg;
    if ((9 < (ushort)(WVar1 + L'￐')) &&
       (((!bVar4 || (0x25 < (ushort)WVar1 - 0x41)) ||
        ((0x3f0000003fU >> ((ulong)((ushort)WVar1 - 0x41) & 0x3f) & 1) == 0)))) {
      return iVar11 * iVar9;
    }
    if (0x39 < (ushort)WVar1) {
      if (!bVar4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/CmdParser.cpp"
                           ,0xc9,"(base == 16)","base == 16");
        if (!bVar5) goto LAB_003539ac;
        *puVar6 = 0;
      }
      if (0xf < (int)((uint)(ushort)*this->pszCurrentArg +
                      (uint)((ushort)*this->pszCurrentArg < 0x46) * 0x20 + -0x57)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/CmdParser.cpp"
                           ,0xd3,"(currentDigit < 16)","currentDigit < 16");
        if (!bVar5) {
LAB_003539ac:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar6 = 0;
      }
    }
    iVar11 = iVar11 * iVar10 + (uint)(ushort)*this->pszCurrentArg + -0x30;
    if (iVar11 < 0) break;
    this->pszCurrentArg = this->pszCurrentArg + 1;
  } while( true );
  puVar7 = (undefined8 *)__cxa_allocate_exception(8);
  pcVar8 = L"Integer too large to parse";
LAB_00353998:
  *puVar7 = pcVar8;
  __cxa_throw(puVar7,&Exception::typeinfo,0);
}

Assistant:

int
CmdLineArgsParser::ParseInteger()
{
    int result  = 0;
    int sign    = 1;

    if('-' == CurChar())
    {
        sign = -1;
        NextChar();
    }
    if(!IsDigit())
    {
        throw Exception(_u("Integer Expected"));
    }

    int base = 10;

    if ('0' == CurChar())
    {
        NextChar();
        if (CurChar() == 'x')
        {
            NextChar();
            base = 16;
        }
        // Should the else case be parse as octal?
    }

    while(IsDigit() || (base == 16 && IsHexDigit()))
    {
        int currentDigit = (int)(CurChar() - '0');
        if (currentDigit > 9)
        {
            Assert(base == 16);
            if (CurChar() < 'F')
            {
                currentDigit = 10 + (int)(CurChar() - 'A');
            }
            else
            {
                currentDigit = 10 + (int)(CurChar() - 'a');
            }

            Assert(currentDigit < 16);
        }

        result = result * base + (int)(CurChar() - '0');
        if(result < 0)
        {
            // overflow or underflow in case sign = -1
            throw Exception(_u("Integer too large to parse"));
        }

        NextChar();
    }

    return result * sign;
}